

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBuffer.h
# Opt level: O0

string * __thiscall
aeron::concurrent::AtomicBuffer::getStringWithoutLength_abi_cxx11_
          (string *__return_storage_ptr__,AtomicBuffer *this,index_t offset,size_t length)

{
  uint8_t *puVar1;
  uchar *__end;
  long lVar2;
  allocator<char> local_29;
  size_t local_28;
  size_t length_local;
  AtomicBuffer *pAStack_18;
  index_t offset_local;
  AtomicBuffer *this_local;
  
  local_28 = length;
  length_local._4_4_ = offset;
  pAStack_18 = this;
  this_local = (AtomicBuffer *)__return_storage_ptr__;
  boundsCheck(this,offset,length);
  puVar1 = this->m_buffer;
  lVar2 = (long)length_local._4_4_;
  __end = puVar1 + lVar2 + local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<unsigned_char*,void>
            ((string *)__return_storage_ptr__,puVar1 + lVar2,__end,&local_29);
  std::allocator<char>::~allocator(&local_29);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getStringWithoutLength(util::index_t offset, size_t length) const
    {
        boundsCheck(offset, length);
        return std::string(m_buffer + offset, m_buffer + offset + length);
    }